

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxmlparser.cpp
# Opt level: O3

char * __thiscall
TiXmlUnknown::Parse(TiXmlUnknown *this,char *p,TiXmlParsingData *data,TiXmlEncoding encoding)

{
  TiXmlDocument *this_00;
  char *pcVar1;
  char *pcVar2;
  TiXmlString *this_01;
  char local_29;
  
  this_00 = TiXmlNode::GetDocument(&this->super_TiXmlNode);
  pcVar1 = TiXmlBase::SkipWhiteSpace(p,encoding);
  if (data != (TiXmlParsingData *)0x0) {
    TiXmlParsingData::Stamp(data,pcVar1,encoding);
    (this->super_TiXmlNode).super_TiXmlBase.location = data->cursor;
  }
  if ((pcVar1 == (char *)0x0) || (*pcVar1 != '<')) {
    if (this_00 != (TiXmlDocument *)0x0) {
      TiXmlDocument::SetError(this_00,9,pcVar1,data,encoding);
    }
    pcVar1 = (char *)0x0;
  }
  else {
    this_01 = &(this->super_TiXmlNode).value;
    TiXmlString::assign(this_01,"",0);
    while( true ) {
      pcVar2 = pcVar1 + 1;
      local_29 = *pcVar2;
      if ((local_29 == '\0') || (local_29 == '>')) break;
      TiXmlString::append(this_01,&local_29,1);
      pcVar1 = pcVar2;
    }
    pcVar1 = pcVar1 + 2;
    if (local_29 != '>') {
      pcVar1 = pcVar2;
    }
  }
  return pcVar1;
}

Assistant:

const char* TiXmlUnknown::Parse( const char* p, TiXmlParsingData* data, TiXmlEncoding encoding )
{
	TiXmlDocument* document = GetDocument();
	p = SkipWhiteSpace( p, encoding );

	if ( data )
	{
		data->Stamp( p, encoding );
		location = data->Cursor();
	}
	if ( !p || !*p || *p != '<' )
	{
		if ( document ) document->SetError( TIXML_ERROR_PARSING_UNKNOWN, p, data, encoding );
		return 0;
	}
	++p;
    value = "";

	while ( p && *p && *p != '>' )
	{
		value += *p;
		++p;
	}

	if ( !p )
	{
		if ( document )	
			document->SetError( TIXML_ERROR_PARSING_UNKNOWN, 0, 0, encoding );
	}
	if ( p && *p == '>' )
		return p+1;
	return p;
}